

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O1

bool bfs_dinic(int s,int t)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  int next;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_90 = s;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_90);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  *(undefined4 *)((anonymous_namespace)::dis + (long)local_90 * 4) = 0;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (*(int *)((anonymous_namespace)::dis + (long)t * 4) != -1) break;
      lVar4 = (long)*local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      piVar2 = *(int **)((anonymous_namespace)::edges_dup + 8 + lVar4 * 0x18);
      for (piVar5 = *(int **)((anonymous_namespace)::edges_dup + lVar4 * 0x18); piVar5 != piVar2;
          piVar5 = piVar5 + 1) {
        local_8c = *(int *)((anonymous_namespace)::edgelist + 4 + (long)*piVar5 * 0x10);
        if ((*(int *)((anonymous_namespace)::dis + (long)local_8c * 4) == -1) &&
           (lVar3 = (anonymous_namespace)::edgelist + (long)*piVar5 * 0x10,
           *(int *)(lVar3 + 0xc) < *(int *)(lVar3 + 8))) {
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_88,&local_8c);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_8c;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          *(int *)((anonymous_namespace)::dis + (long)local_8c * 4) =
               *(int *)((anonymous_namespace)::dis + lVar4 * 4) + 1;
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  iVar1 = *(int *)((anonymous_namespace)::dis + (long)t * 4);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return iVar1 != -1;
}

Assistant:

bool bfs_dinic(int s, int t) {
    queue<int> q;
    q.push(s);
    dis[s] = 0;
    
    while (!q.empty() && dis[t] == -1) {
        int v = q.front();
        q.pop();
        
        for (int ind : edges_dup[v]) {
            int next = edgelist[ind].b;
            
            if (dis[next] == -1 && edgelist[ind].flow < edgelist[ind].c) {
                q.push(next);
                dis[next] = dis[v] + 1;
            }
        }
    }
    
    return dis[t] != -1;
}